

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterNext_None(Fts5Index *p,Fts5SegIter *pIter,int *pbNewTerm)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int *pRc;
  Fts5Buffer *pBuf;
  size_t sVar4;
  int local_4c;
  u8 *puStack_48;
  int nList;
  char *zTerm;
  u8 *pList;
  u64 uStack_30;
  int nKeep;
  i64 iDelta;
  int *piStack_20;
  int iOff;
  int *pbNewTerm_local;
  Fts5SegIter *pIter_local;
  Fts5Index *p_local;
  
  iDelta._4_4_ = pIter->iLeafOffset;
  piStack_20 = pbNewTerm;
  pbNewTerm_local = (int *)pIter;
  pIter_local = (Fts5SegIter *)p;
  if ((pIter->pSeg != (Fts5StructureSegment *)0x0) && (pIter->pLeaf->szLeaf <= iDelta._4_4_)) {
    fts5SegIterNextPage(p,pIter);
    if (pIter_local->iTermLeafOffset != 0) {
      return;
    }
    if (*(long *)(pbNewTerm_local + 4) == 0) {
      return;
    }
    pbNewTerm_local[0x1a] = 0;
    pbNewTerm_local[0x1b] = 0;
    iDelta._4_4_ = 4;
  }
  iVar3 = iDelta._4_4_;
  if (iDelta._4_4_ < pbNewTerm_local[0xf]) {
    bVar1 = sqlite3Fts5GetVarint
                      ((uchar *)(**(long **)(pbNewTerm_local + 4) + (long)iDelta._4_4_),
                       &stack0xffffffffffffffd0);
    iDelta._4_4_ = (uint)bVar1 + iDelta._4_4_;
    pbNewTerm_local[8] = iDelta._4_4_;
    *(u64 *)(pbNewTerm_local + 0x1a) = uStack_30 + *(long *)(pbNewTerm_local + 0x1a);
  }
  else {
    if ((pbNewTerm_local[2] & 1U) != 0) {
LAB_0027569d:
      fts5DataRelease(*(Fts5Data **)(pbNewTerm_local + 4));
      pbNewTerm_local[4] = 0;
      pbNewTerm_local[5] = 0;
      return;
    }
    if (*(long *)pbNewTerm_local == 0) {
      zTerm = (char *)0x0;
      puStack_48 = (u8 *)0x0;
      sqlite3Fts5HashScanNext((Fts5Hash *)pIter_local->pNextLeaf);
      sqlite3Fts5HashScanEntry
                ((Fts5Hash *)pIter_local->pNextLeaf,(char **)&stack0xffffffffffffffb8,(u8 **)&zTerm,
                 &local_4c);
      if (zTerm == (char *)0x0) goto LAB_0027569d;
      **(undefined8 **)(pbNewTerm_local + 4) = zTerm;
      *(int *)(*(long *)(pbNewTerm_local + 4) + 8) = local_4c;
      *(int *)(*(long *)(pbNewTerm_local + 4) + 0xc) = local_4c;
      pbNewTerm_local[0xf] = local_4c;
      pRc = &pIter_local->iTermLeafOffset;
      pBuf = (Fts5Buffer *)(pbNewTerm_local + 0x16);
      sVar4 = strlen((char *)puStack_48);
      sqlite3Fts5BufferSet(pRc,pBuf,(int)sVar4,puStack_48);
      bVar1 = sqlite3Fts5GetVarint((uchar *)zTerm,(u64 *)(pbNewTerm_local + 0x1a));
      pbNewTerm_local[8] = (uint)bVar1;
    }
    else {
      pList._4_4_ = 0;
      iVar2 = fts5LeafFirstTermOff(*(Fts5Data **)(pbNewTerm_local + 4));
      if (iVar3 != iVar2) {
        iVar3 = sqlite3Fts5GetVarint32
                          ((uchar *)(**(long **)(pbNewTerm_local + 4) + (long)iDelta._4_4_),
                           (u32 *)((long)&pList + 4));
        iDelta._4_4_ = iVar3 + iDelta._4_4_;
      }
      pbNewTerm_local[8] = iDelta._4_4_;
      fts5SegIterLoadTerm((Fts5Index *)pIter_local,(Fts5SegIter *)pbNewTerm_local,pList._4_4_);
    }
    if (piStack_20 != (int *)0x0) {
      *piStack_20 = 1;
    }
  }
  fts5SegIterLoadNPos((Fts5Index *)pIter_local,(Fts5SegIter *)pbNewTerm_local);
  return;
}

Assistant:

static void fts5SegIterNext_None(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5SegIter *pIter,             /* Iterator to advance */
  int *pbNewTerm                  /* OUT: Set for new term */
){
  int iOff;

  assert( p->rc==SQLITE_OK );
  assert( (pIter->flags & FTS5_SEGITER_REVERSE)==0 );
  assert( p->pConfig->eDetail==FTS5_DETAIL_NONE );

  ASSERT_SZLEAF_OK(pIter->pLeaf);
  iOff = pIter->iLeafOffset;

  /* Next entry is on the next page */
  if( pIter->pSeg && iOff>=pIter->pLeaf->szLeaf ){
    fts5SegIterNextPage(p, pIter);
    if( p->rc || pIter->pLeaf==0 ) return;
    pIter->iRowid = 0;
    iOff = 4;
  }

  if( iOff<pIter->iEndofDoclist ){
    /* Next entry is on the current page */
    i64 iDelta;
    iOff += sqlite3Fts5GetVarint(&pIter->pLeaf->p[iOff], (u64*)&iDelta);
    pIter->iLeafOffset = iOff;
    pIter->iRowid += iDelta;
  }else if( (pIter->flags & FTS5_SEGITER_ONETERM)==0 ){
    if( pIter->pSeg ){
      int nKeep = 0;
      if( iOff!=fts5LeafFirstTermOff(pIter->pLeaf) ){
        iOff += fts5GetVarint32(&pIter->pLeaf->p[iOff], nKeep);
      }
      pIter->iLeafOffset = iOff;
      fts5SegIterLoadTerm(p, pIter, nKeep);
    }else{
      const u8 *pList = 0;
      const char *zTerm = 0;
      int nList;
      sqlite3Fts5HashScanNext(p->pHash);
      sqlite3Fts5HashScanEntry(p->pHash, &zTerm, &pList, &nList);
      if( pList==0 ) goto next_none_eof;
      pIter->pLeaf->p = (u8*)pList;
      pIter->pLeaf->nn = nList;
      pIter->pLeaf->szLeaf = nList;
      pIter->iEndofDoclist = nList;
      sqlite3Fts5BufferSet(&p->rc,&pIter->term, (int)strlen(zTerm), (u8*)zTerm);
      pIter->iLeafOffset = fts5GetVarint(pList, (u64*)&pIter->iRowid);
    }

    if( pbNewTerm ) *pbNewTerm = 1;
  }else{
    goto next_none_eof;
  }

  fts5SegIterLoadNPos(p, pIter);

  return;
 next_none_eof:
  fts5DataRelease(pIter->pLeaf);
  pIter->pLeaf = 0;
}